

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O2

bool __thiscall pg::TSPMSolver::lift(TSPMSolver *this,int node,int target)

{
  int *pm;
  uint uVar1;
  int *piVar2;
  Game *pGVar3;
  int *b;
  bool bVar4;
  int pl;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ostream *poVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint *puVar15;
  uint local_64;
  uint local_54;
  
  lVar12 = (long)node;
  pm = this->pms + this->k * lVar12;
  if ((*pm != -1) || (pm[1] != -1)) {
    this->lift_attempt = this->lift_attempt + 1;
    pl = Solver::owner(&this->super_Solver,node);
    iVar6 = ((this->super_Solver).game)->_priority[lVar12];
    uVar7 = (ulong)iVar6;
    if (1 < (this->super_Solver).trace) {
      poVar8 = std::operator<<((this->super_Solver).logger,"\x1b[1mupdating node ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,node);
      poVar8 = std::operator<<(poVar8,"/");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
      iVar5 = Solver::owner(&this->super_Solver,node);
      pcVar11 = " (odd)";
      if (iVar5 == 0) {
        pcVar11 = " (even)";
      }
      poVar8 = std::operator<<(poVar8,pcVar11);
      std::operator<<(poVar8,"\x1b[m with current progress measure");
      pm_stream(this,(this->super_Solver).logger,pm);
      std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
    }
    iVar5 = 1 - pl;
    local_54 = 0xffffffff;
    if (pm[pl] == -1) {
      local_64 = 0xffffffff;
    }
    else {
      if (1 < (this->super_Solver).trace) {
        poVar8 = std::operator<<((this->super_Solver).logger,"computing max");
        std::endl<char,std::char_traits<char>>(poVar8);
        pm_copy(this,this->tmp,pm,iVar5);
      }
      if (target == -1) {
        pGVar3 = (this->super_Solver).game;
        puVar15 = (uint *)(pGVar3->_outedges + pGVar3->_firstouts[lVar12]);
        local_64 = 0xffffffff;
        local_54 = local_64;
        while( true ) {
          uVar14 = *puVar15;
          uVar13 = (ulong)(int)uVar14;
          if (uVar13 == 0xffffffffffffffff) break;
          uVar10 = local_54;
          if ((((this->super_Solver).disabled)->_bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
            Prog(this,this->tmp,this->pms + this->k * uVar13,iVar6,pl);
            if (1 < (this->super_Solver).trace) {
              poVar8 = std::operator<<((this->super_Solver).logger,"successor node ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar14);
              poVar8 = std::operator<<(poVar8,"/");
              poVar8 = (ostream *)
                       std::ostream::operator<<
                                 (poVar8,((this->super_Solver).game)->_priority[uVar13]);
              std::operator<<(poVar8," results in");
              pm_stream(this,(this->super_Solver).logger,this->tmp);
              std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
            }
            piVar2 = this->tmp;
            bVar4 = pm_less(this,pm,piVar2,iVar6,pl);
            if ((bVar4) && (pm_copy(this,pm,piVar2,pl), uVar10 = uVar14, pl == 0)) {
              local_64 = uVar14;
              uVar10 = local_54;
            }
          }
          local_54 = uVar10;
          puVar15 = puVar15 + 1;
        }
      }
      else {
        Prog(this,this->tmp,this->pms + this->k * (long)target,iVar6,pl);
        if (1 < (this->super_Solver).trace) {
          poVar8 = std::operator<<((this->super_Solver).logger,"successor node ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,target);
          poVar8 = std::operator<<(poVar8,"/");
          poVar8 = (ostream *)
                   std::ostream::operator<<(poVar8,((this->super_Solver).game)->_priority[target]);
          std::operator<<(poVar8," results in");
          pm_stream(this,(this->super_Solver).logger,this->tmp);
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        }
        piVar2 = this->tmp;
        bVar4 = pm_less(this,pm,piVar2,iVar6,pl);
        local_64 = local_54;
        if (bVar4) {
          pm_copy(this,pm,piVar2,pl);
          local_54 = -(uint)(pl == 0) | target;
          local_64 = -(uint)(pl != 0) | target;
        }
      }
    }
    uVar14 = local_54;
    if ((pm[iVar5] != -1) && ((target == -1 || (this->strategy[lVar12] == target)))) {
      if (1 < (this->super_Solver).trace) {
        poVar8 = std::operator<<((this->super_Solver).logger,"computing min");
        std::endl<char,std::char_traits<char>>(poVar8);
        if (1 < (this->super_Solver).trace) {
          pm_copy(this,this->tmp,pm,pl);
        }
      }
      pGVar3 = (this->super_Solver).game;
      puVar15 = (uint *)(pGVar3->_outedges + pGVar3->_firstouts[lVar12]);
      uVar10 = 0xffffffff;
      while( true ) {
        uVar1 = *puVar15;
        uVar13 = (ulong)(int)uVar1;
        if (uVar13 == 0xffffffffffffffff) break;
        if ((((this->super_Solver).disabled)->_bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
          Prog(this,this->tmp,this->pms + this->k * uVar13,iVar6,iVar5);
          if (1 < (this->super_Solver).trace) {
            poVar8 = std::operator<<((this->super_Solver).logger,"successor node ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar1);
            poVar8 = std::operator<<(poVar8,"/");
            poVar8 = (ostream *)
                     std::ostream::operator<<(poVar8,((this->super_Solver).game)->_priority[uVar13])
            ;
            std::operator<<(poVar8," results in");
            pm_stream(this,(this->super_Solver).logger,this->tmp);
            std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
          }
          piVar2 = this->tmp;
          b = this->best;
          if ((uVar10 == 0xffffffff) || (bVar4 = pm_less(this,piVar2,b,iVar6,iVar5), bVar4)) {
            uVar13 = this->k;
            for (uVar9 = 0; uVar10 = uVar1, (~((long)uVar13 >> 0x3f) & uVar13) != uVar9;
                uVar9 = uVar9 + 1) {
              b[uVar9] = piVar2[uVar9];
            }
          }
        }
        puVar15 = puVar15 + 1;
      }
      this->strategy[lVar12] = uVar10;
      piVar2 = this->best;
      bVar4 = pm_less(this,pm,piVar2,iVar6,iVar5);
      if ((bVar4) && (pm_copy(this,pm,piVar2,iVar5), uVar14 = uVar10, pl == 1)) {
        local_64 = uVar10;
        uVar14 = local_54;
      }
    }
    if ((local_64 != 0xffffffff) || (uVar14 != 0xffffffff)) {
      if ((this->super_Solver).trace != 0) {
        poVar8 = std::operator<<((this->super_Solver).logger,"\x1b[1;32mupdated node ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,node);
        poVar8 = std::operator<<(poVar8,"/");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
        iVar6 = Solver::owner(&this->super_Solver,node);
        pcVar11 = " (odd)";
        if (iVar6 == 0) {
          pcVar11 = " (even)";
        }
        poVar8 = std::operator<<(poVar8,pcVar11);
        std::operator<<(poVar8,"\x1b[m to");
        pm_stream(this,(this->super_Solver).logger,pm);
        std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
      }
      if (((local_64 != 0xffffffff) && ((uVar7 & 1) == 0)) && (*pm == -1)) {
        this->counts[uVar7] = this->counts[uVar7] + -1;
      }
      if (((uVar14 != 0xffffffff) && ((uVar7 & 1) != 0)) && (pm[1] == -1)) {
        this->counts[uVar7] = this->counts[uVar7] + -1;
      }
      this->lift_count = this->lift_count + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool
TSPMSolver::lift(int node, int target)
{
    // obtain ptr to current progress measure
    int *pm = pms + k*node;

    // check if already Top for both players
    if (pm[0] == -1 and pm[1] == -1) return false;

    lift_attempt++;

    // initialize stuff
    const int pl_max = owner(node);
    const int pl_min = 1 - pl_max;
    const int d = priority(node);

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[1mupdating node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m with current progress measure";
        pm_stream(logger, pm);
        logger << std::endl;
    }
#endif

    int best_ch0 = -1, best_ch1 = -1;

    // do max for player <pl_max>
    if (pm[pl_max] != -1) {
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "computing max" << std::endl;
            pm_copy(tmp, pm, 1-pl_max);
        }
#endif
        if (target != -1) {
            // just look at target
            Prog(tmp, pms + k*target, d, pl_max);
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "successor node " << target << "/" << priority(target) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }
#endif
            if (pm_less(pm, tmp, d, pl_max)) {
                pm_copy(pm, tmp, pl_max);
                if (pl_max) best_ch1 = target;
                else best_ch0 = target;
            }
        } else {
            for (auto curedge = outs(node); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                Prog(tmp, pms + k*to, d, pl_max);
#ifndef NDEBUG
                if (trace >= 2) {
                    logger << "successor node " << to << "/" << priority(to) << " results in";
                    pm_stream(logger, tmp);
                    logger << std::endl;
                }
#endif
                if (pm_less(pm, tmp, d, pl_max)) {
                    pm_copy(pm, tmp, pl_max);
                    if (pl_max) best_ch1 = to;
                    else best_ch0 = to;
                }
            }
        }
    }

    // do min for player <pl_min>
    if (pm[pl_min] != -1 and (target == -1 or target == strategy[node])) {
#ifndef NDEBUG
        if (trace >= 2) logger << "computing min" << std::endl;
        if (trace >= 2) pm_copy(tmp, pm, 1-pl_min);
#endif
        int best_to = -1;
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue;
            Prog(tmp, pms + k*to, d, pl_min);
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "successor node " << to << "/" << priority(to) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }
#endif
            if (best_to == -1 or pm_less(tmp, best, d, pl_min)) {
                for (int i=0; i<k; i++) best[i] = tmp[i];
                best_to = to;
            }
        }

        strategy[node] = best_to;
        // note: sometimes only the strategy changes, but the lowest pm stays the same
        // now "best" contains the smallest Prog, which may be higher than the current min
        if (pm_less(pm, best, d, pl_min)) {
            pm_copy(pm, best, pl_min);
            if (pl_min) best_ch1 = best_to;
            else best_ch0 = best_to;
        }
    }

    bool ch0 = best_ch0 != -1;
    bool ch1 = best_ch1 != -1;

    if (ch0 or ch1) {
        if (trace) {
            logger << "\033[1;32mupdated node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m to";
            pm_stream(logger, pm);
            logger << std::endl;
        }
        // update counts if a changed pm is now Top, but only if priority has same parity as winner
        if (ch0 and pm[0] == -1 and (d&1) == 0) counts[d]--;
        if (ch1 and pm[1] == -1 and (d&1) == 1) counts[d]--;
        // increase count and return true
        lift_count++;
        return true;
    } else {
        return false;
    }
}